

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Validator.cpp
# Opt level: O3

void __thiscall
arangodb::velocypack::Validator::validateArray(Validator *this,uint8_t *ptr,size_t length)

{
  uint8_t uVar1;
  uint uVar2;
  long lVar3;
  ValueLength VVar4;
  ulong uVar5;
  ulong *puVar6;
  Validator *pVVar7;
  ulong uVar8;
  Exception *pEVar9;
  byte bVar10;
  Validator *pVVar11;
  ulong uVar12;
  long lVar13;
  Validator *pVVar14;
  char *pcVar15;
  long lVar16;
  ulong uVar17;
  ulong uVar18;
  Validator *pVVar19;
  Validator *pVVar20;
  size_t length_00;
  long lVar21;
  bool bVar22;
  Validator *pVStack_40;
  Validator *pVStack_38;
  
  uVar1 = *ptr;
  if (uVar1 == '\x13') {
    validateBufferLength(this,4,length,true);
    pVStack_40 = (Validator *)(ptr + 1);
    VVar4 = ReadVariableLengthValue<false>((uint8_t **)&pVStack_40,ptr + length + 1);
    pVVar19 = pVStack_40;
    if ((VVar4 <= length) && (3 < VVar4)) {
      pVStack_40 = (Validator *)(ptr + (VVar4 - 1));
      VVar4 = ReadVariableLengthValue<true>((uint8_t **)&pVStack_40,ptr + VVar4);
      if (VVar4 != 0) {
        pVVar7 = (Validator *)((long)&pVStack_40->options + 1);
        while (pVVar19 < pVVar7) {
          validatePart(this,(uint8_t *)pVVar19,(long)pVVar7 - (long)pVVar19,true);
          uVar5 = (ulong)"\x01\x01"[*(byte *)&pVVar19->options];
          pVStack_38 = pVVar19;
          if (uVar5 == 0) {
            uVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&pVStack_38,(uint8_t *)pVVar19);
          }
          VVar4 = VVar4 - 1;
          pVVar19 = (Validator *)((long)&pVVar19->options + uVar5);
          if (VVar4 == 0) {
            return;
          }
        }
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar15 = "Array items number is out of bounds";
        goto LAB_001146dc;
      }
    }
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar15 = "Array length value is out of bounds";
LAB_001146dc:
    Exception::Exception(pEVar9,ValidatorInvalidLength,pcVar15);
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
  if ((byte)(uVar1 - 2) < 4) {
    uVar1 = *ptr;
    lVar21 = 1L << (uVar1 - 2 & 0x3f);
    pVStack_38 = this;
    validateBufferLength(this,lVar21 + 2,length,true);
    if (lVar21 - 1U < 8) {
      switch(uVar1) {
      case '\x02':
        uVar5 = (ulong)ptr[1];
        break;
      case '\x03':
        uVar5 = (ulong)*(ushort *)(ptr + 1);
        break;
      case '\x04':
        uVar5 = (ulong)*(uint *)(ptr + 1);
        break;
      case '\x05':
        uVar5 = *(ulong *)(ptr + 1);
      }
      if (length < uVar5) {
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar15 = "Array length is out of bounds";
        goto LAB_00114932;
      }
      uVar18 = 9;
      if ((long)uVar5 < 9) {
        uVar18 = uVar5;
      }
      pVVar19 = (Validator *)(ptr + uVar18);
    }
    else {
      uVar5 = 0;
      pVVar19 = (Validator *)ptr;
    }
    lVar16 = lVar21 + 1;
    lVar13 = lVar16;
    pVVar7 = (Validator *)(ptr + lVar21 + 1);
    if ((Validator *)(ptr + lVar21 + 1) < pVVar19) {
      lVar13 = (long)pVVar19 - (long)ptr;
      lVar21 = lVar16;
      do {
        if (ptr[lVar21] != '\0') {
          lVar13 = lVar21;
          pVVar7 = (Validator *)(ptr + lVar21);
          break;
        }
        lVar3 = lVar21 + 1;
        lVar21 = lVar21 + 1;
        pVVar7 = pVVar19;
      } while ((Validator *)(ptr + lVar3) < pVVar19);
    }
    uVar18 = uVar5 - lVar13;
    if (uVar18 == 0 || (long)uVar5 < lVar13) {
      pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar15 = "Array structure is invalid";
    }
    else if (lVar13 == 9 || lVar13 == lVar16) {
      validatePart(pVStack_38,(uint8_t *)pVVar7,length - lVar13,true);
      VVar4 = (ValueLength)"\x01\x01"[*(byte *)&pVVar7->options];
      pVStack_40 = pVVar7;
      if ((VVar4 == 0) &&
         (VVar4 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pVStack_40,(uint8_t *)pVVar7), VVar4 == 0)) {
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar15 = "Array itemSize value is invalid";
      }
      else if (uVar18 < VVar4) {
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar15 = "Array nrItems value is invalid";
      }
      else {
        uVar18 = uVar18 / VVar4;
        pVVar19 = (Validator *)((long)&pVVar7->options + VVar4);
        length_00 = (long)(ptr + length) - (long)pVVar19;
        do {
          uVar18 = uVar18 - 1;
          if (uVar18 == 0) {
            return;
          }
          if ((Validator *)(ptr + length) <= pVVar19) {
            pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
            pcVar15 = "Array value is out of bounds";
            goto LAB_00114932;
          }
          validatePart(pVStack_38,(uint8_t *)pVVar19,length_00,true);
          uVar5 = (ulong)"\x01\x01"[*(byte *)&pVVar19->options];
          pVStack_40 = pVVar19;
          if (uVar5 == 0) {
            uVar5 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                    byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                     *)&pVStack_40,(uint8_t *)pVVar19);
          }
          pVVar19 = (Validator *)((long)&pVVar19->options + VVar4);
          length_00 = length_00 - VVar4;
        } while (uVar5 == VVar4);
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar15 = "Unexpected Array value length";
      }
    }
    else {
      pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar15 = "Array padding is invalid";
    }
LAB_00114932:
    Exception::Exception(pEVar9,ValidatorInvalidLength,pcVar15);
    __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
  }
  if (3 < (byte)(uVar1 - 6)) {
    return;
  }
  uVar1 = *ptr;
  bVar10 = uVar1 - 6;
  lVar21 = 1L << (bVar10 & 0x3f);
  pVStack_40 = this;
  validateBufferLength(this,(2L << (bVar10 & 0x3f)) + 2,length,true);
  puVar6 = (ulong *)(ptr + 1);
  uVar5 = lVar21 - 1;
  if (uVar5 < 8) {
    switch(uVar1) {
    case '\x06':
      uVar18 = (ulong)(byte)*puVar6;
      break;
    case '\a':
      uVar18 = (ulong)(ushort)*puVar6;
      break;
    case '\b':
      uVar18 = (ulong)*(uint *)(ptr + 1);
      break;
    case '\t':
      uVar18 = *puVar6;
    }
    if (length < uVar18) {
      pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar15 = "Array length is out of bounds";
      goto LAB_00114d9e;
    }
  }
  else {
    uVar18 = 0;
  }
  if (uVar1 == '\t') {
    if (7 < uVar5) goto LAB_00114dc1;
    uVar17 = *(ulong *)(ptr + (uVar18 - lVar21));
    if (uVar17 == 0) goto LAB_00114dc1;
    pVVar19 = (Validator *)((long)(ptr + (uVar18 - lVar21)) - (uVar17 << (bVar10 & 0x3f)));
    if ((pVVar19 < (Validator *)(ptr + lVar21)) ||
       ((Validator *)(ptr + lVar21 * -2 + length) < pVVar19)) goto LAB_00114dd7;
    pVVar7 = (Validator *)((long)puVar6 + lVar21);
    goto code_r0x00114c80;
  }
  if (7 < uVar5) goto LAB_00114dc1;
  puVar6 = (ulong *)((long)puVar6 + lVar21);
  switch(uVar5) {
  case 0:
    uVar17 = (ulong)(byte)*puVar6;
    break;
  case 1:
    uVar17 = (ulong)(ushort)*puVar6;
    break;
  case 2:
    uVar8 = (ulong)(byte)*puVar6;
    uVar17 = (ulong)*(ushort *)((long)puVar6 + 1) << 8;
    goto LAB_00114b5c;
  case 3:
    uVar17 = (ulong)(uint)*puVar6;
    break;
  case 4:
    uVar2 = (uint)*puVar6;
    uVar17 = (ulong)*(byte *)((long)puVar6 + 4);
    goto LAB_00114b58;
  case 5:
    uVar2 = (uint)*puVar6;
    uVar17 = (ulong)*(ushort *)((long)puVar6 + 4);
LAB_00114b58:
    uVar8 = (ulong)uVar2;
    uVar17 = uVar17 << 0x20;
LAB_00114b5c:
    uVar17 = uVar17 | uVar8;
    break;
  case 6:
    uVar17 = (ulong)(uint7)*puVar6;
    break;
  case 7:
    uVar17 = *puVar6;
  }
  if (uVar17 == 0) {
LAB_00114dc1:
    pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
    pcVar15 = "Array nrItems value is invalid";
  }
  else {
    pVVar7 = (Validator *)((long)puVar6 + lVar21);
    pVVar11 = (Validator *)((long)&pVVar7->_nesting + (-2L << (bVar10 & 0x3f)));
    pVVar19 = (Validator *)(ptr + uVar18);
    pVVar14 = pVVar11;
    if (pVVar19 < pVVar11) {
      pVVar14 = pVVar19;
    }
    pVVar20 = pVVar7;
    if (pVVar7 < pVVar14) {
      do {
        if (*(byte *)&pVVar20->options != 0) break;
        pVVar20 = (Validator *)((long)&pVVar20->options + 1);
      } while (pVVar20 < pVVar14);
      bVar22 = pVVar20 != pVVar7;
      pVVar7 = pVVar20;
      if ((bVar22) && (pVVar20 != pVVar11)) {
        pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
        pcVar15 = "Array padding is invalid";
        goto LAB_00114d9e;
      }
    }
    pVVar19 = (Validator *)((long)pVVar19 - (uVar17 << (bVar10 & 0x3f)));
    if (((pVVar19 < (Validator *)(ptr + lVar21 * 2)) || (pVVar19 < pVVar7)) ||
       ((Validator *)(ptr + (length - lVar21)) < pVVar19)) {
LAB_00114dd7:
      pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar15 = "Array index table is out of bounds";
    }
    else {
code_r0x00114c80:
      uVar18 = 0;
      for (; pVVar7 < pVVar19; pVVar7 = (Validator *)((long)&pVVar7->options + uVar8)) {
        validatePart(pVStack_40,(uint8_t *)pVVar7,(long)pVVar19 - (long)pVVar7,true);
        lVar21 = uVar18 << (bVar10 & 0x3f);
        switch(uVar5) {
        case 0:
          uVar8 = (ulong)*(byte *)((long)&pVVar19->options + lVar21);
          break;
        case 1:
          uVar8 = (ulong)*(ushort *)((long)&pVVar19->options + lVar21);
          break;
        case 2:
          uVar12 = (ulong)*(byte *)((long)&pVVar19->options + lVar21);
          uVar8 = (ulong)*(ushort *)((long)&pVVar19->options + lVar21 + 1) << 8;
          goto LAB_00114d0e;
        case 3:
          uVar8 = (ulong)*(uint *)((long)&pVVar19->options + lVar21);
          break;
        case 4:
          uVar2 = *(uint *)((long)&pVVar19->options + lVar21);
          uVar8 = (ulong)*(byte *)((long)&pVVar19->options + lVar21 + 4);
          goto LAB_00114d0a;
        case 5:
          uVar2 = *(uint *)((long)&pVVar19->options + lVar21);
          uVar8 = (ulong)*(ushort *)((long)&pVVar19->options + lVar21 + 4);
LAB_00114d0a:
          uVar12 = (ulong)uVar2;
          uVar8 = uVar8 << 0x20;
LAB_00114d0e:
          uVar8 = uVar8 | uVar12;
          break;
        case 6:
          uVar8 = (ulong)CONCAT34(CONCAT12(*(byte *)((long)&pVVar19->options + lVar21 + 6),
                                           *(undefined2 *)((long)&pVVar19->options + lVar21 + 4)),
                                  *(undefined4 *)((long)&pVVar19->options + lVar21));
          break;
        case 7:
          uVar8 = *(ulong *)((long)&pVVar19->options + lVar21);
          break;
        default:
          uVar8 = 0;
        }
        if (uVar8 != (long)pVVar7 - (long)ptr) {
          pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
          pcVar15 = "Array index table is wrong";
          goto LAB_00114d9e;
        }
        uVar8 = (ulong)"\x01\x01"[*(byte *)&pVVar7->options];
        pVStack_38 = pVVar7;
        if (uVar8 == 0) {
          uVar8 = SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::
                  byteSizeDynamic((SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>
                                   *)&pVStack_38,(uint8_t *)pVVar7);
        }
        uVar18 = uVar18 + 1;
      }
      if (uVar18 == uVar17) {
        return;
      }
      pEVar9 = (Exception *)__cxa_allocate_exception(0x18);
      pcVar15 = "Array has more items than in index";
    }
  }
LAB_00114d9e:
  Exception::Exception(pEVar9,ValidatorInvalidLength,pcVar15);
  __cxa_throw(pEVar9,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

void Validator::validateArray(uint8_t const* ptr, std::size_t length) {
  uint8_t head = *ptr;

  if (head == 0x13U) {
    // compact array
    validateCompactArray(ptr, length);
  } else if (head >= 0x02U && head <= 0x05U) {
    // array without index table
    validateUnindexedArray(ptr, length);
  } else if (head >= 0x06U && head <= 0x09U) {
    // array with index table
    validateIndexedArray(ptr, length);
  } else if (head == 0x01U) {
    // empty array. always valid
  }
}